

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O2

wchar_t chance_of_spell_hit(monster_conflict *mon,monster_spell *spell)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t i;
  wchar_t wVar4;
  int iVar3;
  
  wVar2 = mon->race->level;
  iVar3 = 3;
  if (L'\0' < wVar2) {
    iVar3 = wVar2 * 3;
  }
  wVar2 = iVar3 + spell->hit;
  wVar4 = L'\0';
  while( true ) {
    wVar1 = monster_effect_level((monster *)mon,L'\x02');
    if (wVar1 <= wVar4) break;
    wVar2 = (wVar2 * 0x50) / 100;
    wVar4 = wVar4 + L'\x01';
  }
  return wVar2;
}

Assistant:

static int chance_of_spell_hit(const struct monster *mon,
	const struct monster_spell *spell)
{
	int to_hit = chance_of_spell_hit_base(mon->race, spell);

	/* Apply confusion hit reduction for each level of confusion */
	for (int i = 0; i < monster_effect_level(mon, MON_TMD_CONF); i++) {
		to_hit = to_hit * (100 - CONF_HIT_REDUCTION) / 100;
	}

	return to_hit;
}